

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall
Json::Value::setComment(Value *this,char *comment,size_t len,CommentPlacement placement)

{
  undefined8 *puVar1;
  CommentInfo *pCVar2;
  size_t len_00;
  
  pCVar2 = this->comments_;
  if (pCVar2 == (CommentInfo *)0x0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    pCVar2 = (CommentInfo *)(puVar1 + 1);
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    this->comments_ = pCVar2;
  }
  if (len == 0) {
    len_00 = 0;
  }
  else {
    len_00 = len - 1;
    if (comment[len - 1] != '\n') {
      len_00 = len;
    }
  }
  CommentInfo::setComment(pCVar2 + placement,comment,len_00);
  return;
}

Assistant:

void Value::setComment(const char* comment, size_t len, CommentPlacement placement) {
  if (!comments_)
    comments_ = new CommentInfo[numberOfCommentPlacement];
  if ((len > 0) && (comment[len-1] == '\n')) {
    // Always discard trailing newline, to aid indentation.
    len -= 1;
  }
  comments_[placement].setComment(comment, len);
}